

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetMunitionOrientationFlag(LE_Detonation_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  byte bVar2;
  short sVar3;
  
  if ((KBOOL)((this->m_DetonationFlag2Union).m_ui8Flag & 1) != F) {
    bVar2 = (this->m_DetonationFlag2Union).m_ui8Flag & 0xfe | F;
    (this->m_DetonationFlag2Union).m_ui8Flag = bVar2;
    if (-1 < (char)(this->m_DetonationFlag1Union).m_ui8Flag == (bVar2 != 0)) {
      (this->m_DetonationFlag1Union).m_ui8Flag =
           (this->m_DetonationFlag1Union).m_ui8Flag & 0x7f | (bVar2 != 0) << 7;
      pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
      *pKVar1 = *pKVar1 + (ushort)(bVar2 != 0) * 2 + -1;
    }
    sVar3 = -6;
    if (F) {
      sVar3 = 6;
    }
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + sVar3;
  }
  return;
}

Assistant:

void LE_Detonation_PDU::SetMunitionOrientationFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag2Union.m_ui8MunitionOri )return;

    m_DetonationFlag2Union.m_ui8MunitionOri = F;

    SetFlag2Flag( m_DetonationFlag2Union.m_ui8Flag != 0 );

    if( F )
    {
        m_ui16PDULength += LE_Vector16_3::LE_VECTOR_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_Vector16_3::LE_VECTOR_SIZE;
    }
}